

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NotificationDispatcher.cpp
# Opt level: O1

void __thiscall NotificationDispatcher::Run(NotificationDispatcher *this)

{
  RingBuffer *this_00;
  uchar *puVar1;
  bool bVar2;
  uint uVar3;
  ostream *poVar4;
  long lVar5;
  byte *pbVar6;
  uint result_5;
  uint uVar7;
  ulong uVar8;
  uint result;
  int iVar9;
  ulong uVar10;
  uint result_1;
  uint uVar11;
  unsigned_long result_2;
  uint64_t timestamp;
  uint uVar12;
  uint result_3;
  uint uVar13;
  bool bVar14;
  shared_ptr<Notification> notification;
  stringstream stream;
  uint local_204;
  _Any_data local_1e8;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  Semaphore::acquire(&this->sem);
  if (((this->stopExecution)._M_base._M_i & 1U) == 0) {
    this_00 = &this->ring;
    do {
      uVar10 = (this->ring).dataSize;
      puVar1 = (this->ring).data._M_t.
               super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
               super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
      pbVar6 = (this->ring).read;
      lVar5 = 0;
      iVar9 = 0;
      do {
        iVar9 = iVar9 + ((uint)*pbVar6 << ((byte)lVar5 & 0x1f));
        pbVar6 = puVar1 + (ulong)(pbVar6 + (1 - (long)puVar1)) % uVar10;
        (this->ring).read = pbVar6;
        lVar5 = lVar5 + 8;
      } while (lVar5 != 0x20);
      puVar1 = (this->ring).data._M_t.
               super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
               super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
      lVar5 = 4;
      do {
        pbVar6 = puVar1 + (ulong)(pbVar6 + (1 - (long)puVar1)) % uVar10;
        lVar5 = lVar5 + -1;
      } while (lVar5 != 0);
      (this->ring).read = pbVar6;
      puVar1 = (this->ring).data._M_t.
               super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
               super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
      lVar5 = 0;
      uVar11 = 0;
      do {
        uVar11 = uVar11 + ((uint)*pbVar6 << ((byte)lVar5 & 0x1f));
        pbVar6 = puVar1 + (ulong)(pbVar6 + (1 - (long)puVar1)) % uVar10;
        (this->ring).read = pbVar6;
        lVar5 = lVar5 + 8;
      } while (lVar5 != 0x20);
      uVar10 = (ulong)(iVar9 - 8);
      if (uVar11 != 0) {
        uVar3 = 0;
        do {
          uVar8 = (this->ring).dataSize;
          puVar1 = (this->ring).data._M_t.
                   super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                   super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
          pbVar6 = (this->ring).read;
          lVar5 = 0;
          timestamp = 0;
          do {
            timestamp = timestamp + ((ulong)*pbVar6 << ((byte)lVar5 & 0x3f));
            pbVar6 = puVar1 + (ulong)(pbVar6 + (1 - (long)puVar1)) % uVar8;
            (this->ring).read = pbVar6;
            lVar5 = lVar5 + 8;
          } while (lVar5 != 0x40);
          puVar1 = (this->ring).data._M_t.
                   super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                   super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                   super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
          lVar5 = 0;
          uVar13 = 0;
          do {
            uVar13 = uVar13 + ((uint)*pbVar6 << ((byte)lVar5 & 0x1f));
            pbVar6 = puVar1 + (ulong)(pbVar6 + (1 - (long)puVar1)) % uVar8;
            (this->ring).read = pbVar6;
            lVar5 = lVar5 + 8;
          } while (lVar5 != 0x20);
          local_204 = (int)uVar10 - 0xc;
          bVar14 = uVar13 != 0;
          if (bVar14) {
            uVar12 = 0;
            do {
              uVar10 = (this->ring).dataSize;
              puVar1 = (this->ring).data._M_t.
                       super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                       .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
              pbVar6 = (this->ring).read;
              lVar5 = 0;
              do {
                pbVar6 = puVar1 + (ulong)(pbVar6 + (1 - (long)puVar1)) % uVar10;
                (this->ring).read = pbVar6;
                lVar5 = lVar5 + 8;
              } while (lVar5 != 0x20);
              puVar1 = (this->ring).data._M_t.
                       super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                       .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
              lVar5 = 0;
              uVar8 = 0;
              do {
                uVar7 = (int)uVar8 + ((uint)*pbVar6 << ((byte)lVar5 & 0x1f));
                uVar8 = (ulong)uVar7;
                pbVar6 = puVar1 + (ulong)(pbVar6 + (1 - (long)puVar1)) % uVar10;
                (this->ring).read = pbVar6;
                lVar5 = lVar5 + 8;
              } while (lVar5 != 0x20);
              local_204 = local_204 - 8;
              Find((NotificationDispatcher *)&local_1e8,(uint32_t)this);
              if ((Notification *)local_1e8._M_unused._0_8_ == (Notification *)0x0) {
                RingBuffer::Read(this_00,uVar8);
LAB_0012d748:
                local_204 = local_204 - uVar7;
                bVar2 = true;
              }
              else {
                if (uVar7 == *(uint *)((((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                        (local_1e8._M_unused._M_function_pointer + 0x18))->
                                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                       )._M_impl.super__Vector_impl_data._M_start + 0xc)) {
                  Notification::Notify((Notification *)local_1e8._M_unused._0_8_,timestamp,this_00);
                  goto LAB_0012d748;
                }
                std::__cxx11::stringstream::stringstream(local_1b8);
                std::__ostream_insert<char,std::char_traits<char>>
                          (local_1a8,"Notification sample size: ",0x1a);
                poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
                std::__ostream_insert<char,std::char_traits<char>>(poVar4," doesn\'t match: ",0x10);
                std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
                std::__cxx11::stringbuf::str();
                Logger::Log(2,&local_1d8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
                  operator_delete(local_1d8._M_dataplus._M_p);
                }
                std::__cxx11::stringstream::~stringstream(local_1b8);
                std::ios_base::~ios_base(local_138);
                bVar2 = false;
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._8_8_);
              }
              if (!bVar2) break;
              uVar12 = uVar12 + 1;
              bVar14 = uVar12 < uVar13;
            } while (uVar12 != uVar13);
          }
          if (bVar14) {
            uVar10 = (ulong)local_204;
            break;
          }
          uVar3 = uVar3 + 1;
          uVar10 = (ulong)local_204;
        } while (uVar3 < uVar11);
      }
      RingBuffer::Read(this_00,uVar10);
      Semaphore::acquire(&this->sem);
    } while (((this->stopExecution)._M_base._M_i & 1U) == 0);
  }
  return;
}

Assistant:

void NotificationDispatcher::Run()
{
    for ( ; ; ) {
        sem.acquire();
        if (stopExecution) {
            return;
        }
        auto fullLength = ring.ReadFromLittleEndian<uint32_t>();
        const auto length = ring.ReadFromLittleEndian<uint32_t>();
        (void)length;
        const auto numStamps = ring.ReadFromLittleEndian<uint32_t>();
        fullLength -= sizeof(length) + sizeof(numStamps);
        for (uint32_t stamp = 0; stamp < numStamps; ++stamp) {
            const auto timestamp = ring.ReadFromLittleEndian<uint64_t>();
            const auto numSamples = ring.ReadFromLittleEndian<uint32_t>();
            fullLength -= sizeof(timestamp) + sizeof(numSamples);
            for (uint32_t sample = 0; sample < numSamples; ++sample) {
                const auto hNotify = ring.ReadFromLittleEndian<uint32_t>();
                const auto size = ring.ReadFromLittleEndian<uint32_t>();
                fullLength -= sizeof(hNotify) + sizeof(size);
                const auto notification = Find(hNotify);
                if (notification) {
                    if (size != notification->Size()) {
                        LOG_WARN("Notification sample size: " << size << " doesn't match: " << notification->Size());
                        goto cleanup;
                    }
                    notification->Notify(timestamp, ring);
                } else {
                    ring.Read(size);
                }
                fullLength -= size;
            }
        }
cleanup:
        ring.Read(fullLength);
    }
}